

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

bool __thiscall GdlLookupExpression::TestsJustification(GdlLookupExpression *this)

{
  bool bVar1;
  byte bVar2;
  GrcSymbolTableEntry *in_RDI;
  string *__rhs;
  undefined4 in_stack_ffffffffffffffb0;
  SymbolType in_stack_ffffffffffffffb4;
  string local_30 [40];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = GrcSymbolTableEntry::FitsSymbolType(in_RDI,in_stack_ffffffffffffffb4);
  if (bVar1) {
    __rhs = local_30;
    GrcSymbolTableEntry::FullName_abi_cxx11_
              ((GrcSymbolTableEntry *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8))
    ;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)__rhs);
    std::__cxx11::string::~string(local_30);
    if ((bVar2 & 1) == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GdlLookupExpression::TestsJustification()
{
	if (!m_psymName->FitsSymbolType(ksymtProcState))
		return false;

	if (m_psymName->FullName() == "JustifyMode")
		return true;
	//if (m_psymName->FullName() == "JustifyLevel")
	//	return true;

	return false;
}